

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

PointerType * __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetPointer(PointerType *__return_storage_ptr__,
            GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            *this,SchemaType *schema)

{
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *rhs;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *pGVar1;
  SchemaType *pSVar2;
  bool bVar3;
  
  rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *)(this->schemaMap_).stack_;
  pGVar1 = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            *)(this->schemaMap_).stackTop_;
  bVar3 = rhs == pGVar1;
  if (!bVar3) {
    pSVar2 = (SchemaType *)rhs[1].allocator_;
    while (pSVar2 != schema) {
      bVar3 = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)&rhs[1].nameBuffer_ == pGVar1;
      if (bVar3) goto LAB_0012eb35;
      pSVar2 = (SchemaType *)rhs[2].nameBuffer_;
      rhs = (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *)&rhs[1].nameBuffer_;
    }
    __return_storage_ptr__->tokenCount_ = 0;
    __return_storage_ptr__->parseErrorOffset_ = 0;
    __return_storage_ptr__->nameBuffer_ = (Ch *)0x0;
    __return_storage_ptr__->tokens_ = (Token *)0x0;
    __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->parseErrorCode_ = kPointerParseErrorNone;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::operator=(__return_storage_ptr__,rhs);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
  }
LAB_0012eb35:
  __return_storage_ptr__->tokenCount_ = 0;
  __return_storage_ptr__->parseErrorOffset_ = 0;
  __return_storage_ptr__->nameBuffer_ = (Ch *)0x0;
  __return_storage_ptr__->tokens_ = (Token *)0x0;
  __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
  __return_storage_ptr__->parseErrorCode_ = kPointerParseErrorNone;
  return __return_storage_ptr__;
}

Assistant:

PointerType GetPointer(const SchemaType* schema) const {
        for (const SchemaEntry* target = schemaMap_.template Bottom<SchemaEntry>(); target != schemaMap_.template End<SchemaEntry>(); ++target)
            if (schema == target->schema)
                return target->pointer;
        return PointerType();
    }